

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O2

void __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>::initPrograms
          (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>
           *this,SourceCollections *programCollection)

{
  _Rb_tree_color _Var1;
  ProgramSources *this_00;
  _Base_ptr p_Var2;
  char *in_RCX;
  allocator<char> local_b1;
  InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance> *local_b0;
  SourceCollections *local_a8;
  _Rb_tree_node_base *local_a0;
  undefined1 local_98 [40];
  string local_70;
  string local_50;
  
  local_a0 = &(this->m_shaderPaths)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b0 = this;
  local_a8 = programCollection;
  for (p_Var2 = (this->m_shaderPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 != local_a0; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)p_Var2[1]._M_parent,&local_b1);
    this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_a8->glslSources,&local_50);
    _Var1 = p_Var2[1]._M_color;
    ShaderSourceProvider::getSource_abi_cxx11_
              (&local_70,
               (ShaderSourceProvider *)
               ((local_b0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
               (Archive *)p_Var2[1]._M_parent,in_RCX);
    local_98._0_4_ = _Var1;
    std::__cxx11::string::string((string *)(local_98 + 8),(string *)&local_70);
    glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_98);
    std::__cxx11::string::~string((string *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

virtual void initPrograms (vk::SourceCollections& programCollection) const
	{
		for (ShaderMap::const_iterator i = m_shaderPaths.begin(); i != m_shaderPaths.end(); ++i)
		{
			programCollection.glslSources.add(i->second) <<
				glu::ShaderSource(i->first, ShaderSourceProvider::getSource(m_testCtx.getArchive(), i->second));
		}
	}